

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_socket_unix.cxx
# Opt level: O0

bool ndiSocketOpen(char *hostname,int port,NDISocketHandle *outSocket)

{
  int iVar1;
  undefined1 local_50 [4];
  int r;
  sockaddr_in name;
  unsigned_long addr;
  hostent *hp;
  int on;
  NDISocketHandle sock;
  NDISocketHandle *outSocket_local;
  char *pcStack_18;
  int port_local;
  char *hostname_local;
  
  _on = outSocket;
  outSocket_local._4_4_ = port;
  pcStack_18 = hostname;
  hp._4_4_ = socket(2,1,0);
  hp._0_4_ = 1;
  iVar1 = setsockopt(hp._4_4_,6,1,&hp,4);
  if (iVar1 == 0) {
    addr = (unsigned_long)gethostbyname(pcStack_18);
    if ((hostent *)addr == (hostent *)0x0) {
      name.sin_zero._0_4_ = inet_addr(pcStack_18);
      name.sin_zero[4] = '\0';
      name.sin_zero[5] = '\0';
      name.sin_zero[6] = '\0';
      name.sin_zero[7] = '\0';
      addr = (unsigned_long)gethostbyaddr(name.sin_zero,8,2);
    }
    if (addr == 0) {
      hostname_local._7_1_ = false;
    }
    else {
      local_50._0_2_ = 2;
      memcpy(&r,(void *)**(undefined8 **)(addr + 0x18),(long)*(int *)(addr + 0x14));
      local_50._2_2_ = htons((uint16_t)outSocket_local._4_4_);
      iVar1 = connect(hp._4_4_,(sockaddr *)local_50,0x10);
      if (iVar1 < 0) {
        shutdown(hp._4_4_,2);
        close(hp._4_4_);
        hostname_local._7_1_ = false;
      }
      else {
        *_on = hp._4_4_;
        hostname_local._7_1_ = true;
      }
    }
  }
  else {
    hostname_local._7_1_ = false;
  }
  return hostname_local._7_1_;
}

Assistant:

ndicapiExport bool ndiSocketOpen(const char* hostname, int port, NDISocketHandle& outSocket)
{
  NDISocketHandle sock = socket(AF_INET, SOCK_STREAM, 0);

  // Eliminate windows 0.2 second delay sending (buffering) data.
  int on = 1;
  if (setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char*)&on, sizeof(on)))
  {
    return false;
  }

  struct hostent* hp;
  hp = gethostbyname(hostname);
  if (!hp)
  {
    unsigned long addr = inet_addr(hostname);
    hp = gethostbyaddr((char*)&addr, sizeof(addr), AF_INET);
  }

  if (!hp)
  {
    return false;
  }

  struct sockaddr_in name;
  name.sin_family = AF_INET;
  memcpy(&name.sin_addr, hp->h_addr, hp->h_length);
  name.sin_port = htons(port);

  int r = connect(sock, reinterpret_cast<sockaddr*>(&name), sizeof(name));

  if (r < 0)
  {
    shutdown(sock, 2);
    close(sock);
    return false;
  }

  outSocket = sock;
  return true;
}